

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O3

void deqp::gles2::Functional::getAffineTexCoord2D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  pointer pfVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  float *pfVar5;
  bool bVar6;
  float *pfVar7;
  bool bVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  float v;
  float fVar12;
  float fVar13;
  float v_1;
  float fVar14;
  float fVar15;
  Matrix<float,_2,_2> res;
  Mat2 rotMatrix;
  Matrix<float,_2,_2> mat_1;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58 [6];
  float local_40 [4];
  float local_30 [4];
  
  getBasicTexCoord2D(dst,cellNdx);
  fVar12 = (float)cellNdx * 0.0625 * 6.2831855;
  fVar13 = cosf(fVar12);
  local_40[1] = sinf(fVar12);
  local_40[0] = fVar13;
  local_40[2] = -local_40[1];
  local_40[3] = fVar13;
  if (cellNdx - 4U < 8) {
    local_30[2] = (float)(0xf - cellNdx) * 0.0625;
  }
  else {
    local_30[2] = 0.0;
  }
  local_30[0] = 1.0;
  local_30[1] = 0.0;
  local_30[3] = local_30[2] * 0.0 + 1.0;
  pfVar2 = local_58 + 1;
  local_58[0] = 1.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 1.0;
  pfVar5 = local_58;
  pfVar7 = local_40;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    lVar9 = 0;
    pfVar10 = local_30;
    bVar3 = true;
    do {
      bVar8 = bVar3;
      fVar12 = 0.0;
      lVar11 = 0;
      bVar3 = true;
      do {
        bVar4 = bVar3;
        fVar12 = fVar12 + pfVar7[lVar11 * 2] * pfVar10[lVar11];
        lVar11 = 1;
        bVar3 = false;
      } while (bVar4);
      pfVar5[lVar9 * 2] = fVar12;
      lVar9 = 1;
      pfVar10 = local_30 + 2;
      bVar3 = false;
    } while (bVar8);
    pfVar5 = pfVar2;
    pfVar7 = local_40 + 1;
    bVar3 = false;
  } while (bVar6);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  fVar12 = *pfVar1;
  fVar13 = pfVar1[1];
  local_5c = 0.0;
  local_60 = 0.0;
  pfVar5 = &local_5c;
  pfVar7 = local_58;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    fVar14 = 0.0;
    lVar9 = 0;
    fVar15 = fVar12;
    bVar3 = true;
    do {
      bVar8 = bVar3;
      fVar14 = fVar14 + fVar15 * pfVar7[lVar9 * 2];
      lVar9 = 1;
      fVar15 = fVar13;
      bVar3 = false;
    } while (bVar8);
    *pfVar5 = fVar14;
    pfVar5 = &local_60;
    pfVar7 = pfVar2;
    bVar3 = false;
  } while (bVar6);
  fVar12 = pfVar1[2];
  fVar13 = pfVar1[3];
  local_64 = 0.0;
  local_68 = 0.0;
  pfVar5 = &local_64;
  pfVar7 = local_58;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    fVar14 = 0.0;
    lVar9 = 0;
    fVar15 = fVar12;
    bVar3 = true;
    do {
      bVar8 = bVar3;
      fVar14 = fVar14 + fVar15 * pfVar7[lVar9 * 2];
      lVar9 = 1;
      fVar15 = fVar13;
      bVar3 = false;
    } while (bVar8);
    *pfVar5 = fVar14;
    pfVar5 = &local_68;
    pfVar7 = pfVar2;
    bVar3 = false;
  } while (bVar6);
  fVar12 = pfVar1[4];
  fVar13 = pfVar1[5];
  local_6c = 0.0;
  local_70 = 0.0;
  pfVar5 = &local_6c;
  pfVar7 = local_58;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    fVar14 = 0.0;
    lVar9 = 0;
    fVar15 = fVar12;
    bVar3 = true;
    do {
      bVar8 = bVar3;
      fVar14 = fVar14 + fVar15 * pfVar7[lVar9 * 2];
      lVar9 = 1;
      fVar15 = fVar13;
      bVar3 = false;
    } while (bVar8);
    *pfVar5 = fVar14;
    pfVar5 = &local_70;
    pfVar7 = pfVar2;
    bVar3 = false;
  } while (bVar6);
  fVar12 = pfVar1[6];
  fVar13 = pfVar1[7];
  local_74 = 0.0;
  local_78 = 0.0;
  pfVar5 = &local_74;
  pfVar7 = local_58;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    fVar14 = 0.0;
    lVar9 = 0;
    fVar15 = fVar12;
    bVar3 = true;
    do {
      bVar8 = bVar3;
      fVar14 = fVar14 + fVar15 * pfVar7[lVar9 * 2];
      lVar9 = 1;
      fVar15 = fVar13;
      bVar3 = false;
    } while (bVar8);
    *pfVar5 = fVar14;
    pfVar5 = &local_78;
    pfVar7 = pfVar2;
    bVar3 = false;
  } while (bVar6);
  *pfVar1 = local_5c;
  pfVar1[1] = local_60;
  pfVar1[2] = local_64;
  pfVar1[3] = local_68;
  pfVar1[4] = local_6c;
  pfVar1[5] = local_70;
  pfVar1[6] = local_74;
  pfVar1[7] = local_78;
  return;
}

Assistant:

static void getAffineTexCoord2D (std::vector<float>& dst, int cellNdx)
{
	// Use basic coords as base.
	getBasicTexCoord2D(dst, cellNdx);

	// Rotate based on cell index.
	float		angle		= 2.0f*DE_PI * ((float)cellNdx / 16.0f);
	tcu::Mat2	rotMatrix	= tcu::rotationMatrix(angle);

	// Second and third row are sheared.
	float		shearX		= de::inRange(cellNdx, 4, 11) ? (float)(15-cellNdx) / 16.0f : 0.0f;
	tcu::Mat2	shearMatrix	= tcu::shearMatrix(tcu::Vec2(shearX, 0.0f));

	tcu::Mat2	transform	= rotMatrix * shearMatrix;
	Vec2		p0			= transform * Vec2(dst[0], dst[1]);
	Vec2		p1			= transform * Vec2(dst[2], dst[3]);
	Vec2		p2			= transform * Vec2(dst[4], dst[5]);
	Vec2		p3			= transform * Vec2(dst[6], dst[7]);

	dst[0] = p0.x();	dst[1] = p0.y();
	dst[2] = p1.x();	dst[3] = p1.y();
	dst[4] = p2.x();	dst[5] = p2.y();
	dst[6] = p3.x();	dst[7] = p3.y();
}